

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

solution_t solve(deck_t *f,deck_t *s)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  uint uVar3;
  long *plVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  runtime_error *this;
  ulong uVar8;
  _Self __tmp_4;
  _List_node_base *p_Var9;
  _Self __tmp_7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _Self __tmp;
  uint uVar11;
  bool bVar12;
  string local_70;
  _List_node_base *local_50;
  _List_node_base *local_48;
  _List_node_base *local_40;
  _List_node_base *local_38;
  
  uVar11 = 0;
  local_48 = (_List_node_base *)s;
  local_40 = (_List_node_base *)f;
  do {
    p_Var6 = local_48;
    paVar10 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"deck 1","");
    p_Var2 = local_40;
    dump_deck(&local_70,(deck_t *)local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar10) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"deck 2","");
    dump_deck(&local_70,(deck_t *)p_Var6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar10) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    p_Var6 = p_Var2->_M_next;
    local_38 = local_48->_M_next;
    do {
      p_Var9 = local_48;
      if ((*(int *)&p_Var6[1]._M_next < *(int *)&local_38[1]._M_next) ||
         (p_Var9 = p_Var2, *(int *)&local_38[1]._M_next < *(int *)&p_Var6[1]._M_next))
      goto LAB_0010259d;
      p_Var6 = p_Var6->_M_next;
    } while ((((p_Var6 != p_Var2) &&
              ((((p_Var6 = p_Var6->_M_next, p_Var6 != p_Var2 &&
                 (p_Var6 = p_Var6->_M_next, p_Var6 != p_Var2)) &&
                (p_Var6 = p_Var6->_M_next, p_Var6 != p_Var2)) &&
               ((local_38 = local_38->_M_next, local_38 != local_48 &&
                (local_38 = local_38->_M_next, local_38 != local_48)))))) &&
             (local_38 = local_38->_M_next, local_38 != local_48)) &&
            (local_38 = local_38->_M_next, local_38 != local_48));
    p_Var9 = (_List_node_base *)0x0;
LAB_0010259d:
    uVar11 = uVar11 + 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"turn #",6);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,uVar11);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    p_Var2 = local_40;
    if (p_Var9 != (_List_node_base *)0x0) {
      p_Var7 = local_40->_M_next;
      local_50 = p_Var9;
      while (p_Var7 != p_Var6) {
        p_Var1 = p_Var7->_M_next;
        p_Var5 = (_List_node_base *)operator_new(0x18);
        p_Var5[1]._M_next = p_Var7[1]._M_next;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        p_Var9[1]._M_next = (_List_node_base *)((long)p_Var9[1]._M_next + 1);
        p_Var7 = p_Var2->_M_next;
        p_Var2[1]._M_next = (_List_node_base *)((long)p_Var2[1]._M_next + -1);
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var7,0x18);
        p_Var7 = p_Var1;
      }
      p_Var6 = (_List_node_base *)operator_new(0x18);
      p_Var6[1]._M_next = p_Var7[1]._M_next;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      p_Var9[1]._M_next = (_List_node_base *)((long)p_Var9[1]._M_next + 1);
      p_Var6 = p_Var2->_M_next;
      p_Var2[1]._M_next = (_List_node_base *)((long)p_Var2[1]._M_next + -1);
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var6,0x18);
      p_Var7 = local_38;
      p_Var2 = local_48;
      p_Var9 = local_50;
      p_Var6 = local_48->_M_next;
      while (p_Var6 != p_Var7) {
        p_Var1 = p_Var6->_M_next;
        p_Var5 = (_List_node_base *)operator_new(0x18);
        p_Var5[1]._M_next = p_Var6[1]._M_next;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        p_Var9[1]._M_next = (_List_node_base *)((long)p_Var9[1]._M_next + 1);
        p_Var6 = p_Var2->_M_next;
        p_Var2[1]._M_next = (_List_node_base *)((long)p_Var2[1]._M_next + -1);
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var6,0x18);
        p_Var6 = p_Var1;
      }
      p_Var7 = (_List_node_base *)operator_new(0x18);
      p_Var7[1]._M_next = p_Var6[1]._M_next;
      std::__detail::_List_node_base::_M_hook(p_Var7);
      p_Var9[1]._M_next = (_List_node_base *)((long)p_Var9[1]._M_next + 1);
      p_Var6 = p_Var2->_M_next;
      p_Var2[1]._M_next = (_List_node_base *)((long)p_Var2[1]._M_next + -1);
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var6,0x18);
    }
    p_Var6 = (((_List_base<CCard,_std::allocator<CCard>_> *)&local_40->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    uVar8 = 2;
    if (p_Var6 == local_40) goto LAB_001027c4;
  } while ((p_Var9 != (_List_node_base *)0x0) && (local_48->_M_next != local_48));
  if (p_Var6 != local_40) {
    bVar12 = local_48->_M_next == local_48;
    uVar3 = 0;
    if (bVar12) {
      uVar3 = uVar11;
    }
    if (p_Var9 != (_List_node_base *)0x0 && !bVar12) {
      this = (runtime_error *)
             __cxa_allocate_exception(0x10,p_Var9 == (_List_node_base *)0x0 || bVar12,bVar12,0);
      std::runtime_error::runtime_error(this,"Unexpected exit");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar8 = (ulong)bVar12;
    uVar11 = uVar3;
  }
LAB_001027c4:
  return (solution_t)((ulong)uVar11 << 0x20 | uVar8);
}

Assistant:

solution_t solve(deck_t f, deck_t s)
{
    int turn = 0;
    
    deck_t* winner;
    do
    {
        winner = NULL;

        dump_deck("deck 1", f);
        dump_deck("deck 2", s);

        // take first cards (fight)
        deck_t::const_iterator c1 = f.begin();
        deck_t::const_iterator c2 = s.begin();
            
        do
        {
            if (*c1 < *c2)
            {
                // second have won
                winner = &s;
            }
            else if (*c2 < *c1)
            {
                // first have won
                winner = &f;
            }
            else
            {
                // equal. war is going to start
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                c1++;
                if (f.end() == c1)
                {
                    break;
                }
                
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
                c2++;
                if (s.end() == c2)
                {
                    break;
                }
            }
        } while (NULL == winner);
        turn++;
        
        std::cerr << "turn #" << turn << std::endl;

        if (NULL != winner)
        {
            // move card to the winner
            deck_t::iterator i = f.begin();
            while (i != c1)
            {
                winner->push_back(*i++);
                f.pop_front();
            }
            winner->push_back(*i);
            f.pop_front();

            i = s.begin();
            while (i != c2)
            {
                winner->push_back(*i++);
                s.pop_front();
            }
            winner->push_back(*i);
            s.pop_front();
        }
    } while (!f.empty() && !s.empty() && NULL != winner);
    
    if (f.empty())
    {
        return solution_t(2, turn);
    }
    else if (s.empty())
    {
        return solution_t(1, turn);
    }
    else if (NULL == winner)
    {
        return solution_t(0, 0);    // PAT
    }
    else
    {
        throw std::runtime_error("Unexpected exit");
    }
    
    throw std::runtime_error("Wrong logic");
}